

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::ReferenceMultipleObjectsByHandleArray
          (CSharedMemoryObjectManager *this,CPalThread *pthr,HANDLE *rghHandlesToReference,
          DWORD dwHandleCount,CAllowedObjectTypes *paot,DWORD dwRightsRequired,IPalObject **rgpobjs)

{
  long *plVar1;
  PAL_ERROR PVar2;
  DWORD *pdwRightsGranted;
  DWORD dwRightsGranted_00;
  long lVar3;
  DWORD local_54;
  CAllowedObjectTypes *pCStack_50;
  DWORD dwRightsGranted;
  PCRITICAL_SECTION local_48;
  CSharedMemoryObjectManager *local_40;
  IPalObject *local_38;
  IPalObject *pobj;
  
  local_38 = (IPalObject *)0x0;
  pCStack_50 = paot;
  local_40 = this;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceMultipleObjectsByHandleArray",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x3a3);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (rghHandlesToReference == (HANDLE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceMultipleObjectsByHandleArray",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x3a4);
    fprintf(_stderr,"Expression: NULL != rghHandlesToReference\n");
  }
  if (dwHandleCount == 0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceMultipleObjectsByHandleArray",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x3a5);
    fprintf(_stderr,"Expression: 0 < dwHandleCount\n");
  }
  if (pCStack_50 == (CAllowedObjectTypes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceMultipleObjectsByHandleArray",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x3a6);
    fprintf(_stderr,"Expression: NULL != paot\n");
  }
  if (rgpobjs == (IPalObject **)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceMultipleObjectsByHandleArray",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x3a7);
    fprintf(_stderr,"Expression: NULL != rgpobjs\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    local_48 = &(local_40->m_HandleManager).m_csLock;
    InternalEnterCriticalSection(pthr,local_48);
    if (dwHandleCount != 0) {
      local_40 = (CSharedMemoryObjectManager *)&local_40->m_HandleManager;
      lVar3 = 0;
LAB_0033dcfc:
      pdwRightsGranted = &local_54;
      PVar2 = CSimpleHandleManager::GetObjectFromHandle
                        ((CSimpleHandleManager *)local_40,pthr,
                         *(HANDLE *)((long)rghHandlesToReference + lVar3),pdwRightsGranted,&local_38
                        );
      if ((PVar2 == 0) &&
         (PVar2 = CheckObjectTypeAndRights
                            (local_38,pCStack_50,dwRightsGranted_00,(DWORD)pdwRightsGranted),
         PVar2 == 0)) goto code_r0x0033dd2d;
      InternalLeaveCriticalSection(pthr,local_48);
      for (; lVar3 != 0; lVar3 = lVar3 + -8) {
        plVar1 = *(long **)((long)rgpobjs + lVar3 + -8);
        (**(code **)(*plVar1 + 0x40))(plVar1,pthr);
      }
      if (local_38 != (IPalObject *)0x0) {
        (*local_38->_vptr_IPalObject[8])(local_38,pthr);
      }
      goto LAB_0033dd9c;
    }
LAB_0033dd4d:
    InternalLeaveCriticalSection(pthr,local_48);
    PVar2 = 0;
LAB_0033dd9c:
    if (PAL_InitializeChakraCoreCalled != false) {
      return PVar2;
    }
  }
  abort();
code_r0x0033dd2d:
  *(IPalObject **)((long)rgpobjs + lVar3) = local_38;
  local_38 = (IPalObject *)0x0;
  lVar3 = lVar3 + 8;
  if ((ulong)dwHandleCount << 3 == lVar3) goto LAB_0033dd4d;
  goto LAB_0033dcfc;
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::ReferenceMultipleObjectsByHandleArray(
    CPalThread *pthr,
    HANDLE rghHandlesToReference[],
    DWORD dwHandleCount,
    CAllowedObjectTypes *paot,
    DWORD dwRightsRequired,
    IPalObject *rgpobjs[]            // OUT (caller allocated)
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobj = NULL;
    DWORD dwRightsGranted;
    DWORD dw;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != rghHandlesToReference);
    _ASSERTE(0 < dwHandleCount);
    _ASSERTE(NULL != paot);
    _ASSERTE(NULL != rgpobjs);

    ENTRY("CSharedMemoryObjectManager::ReferenceMultipleObjectsByHandleArray "
        "(this=%p, pthr=%p, rghHandlesToReference=%p, dwHandleCount=%d, "
        "pAllowedTyped=%d, dwRightsRequired=%d, rgpobjs=%p)\n",
        this,
        pthr,
        rghHandlesToReference,
        dwHandleCount,
        paot,
        dwRightsRequired,
        rgpobjs
        );

    m_HandleManager.Lock(pthr);

    for (dw = 0; dw < dwHandleCount; dw += 1)
    {        
        palError = m_HandleManager.GetObjectFromHandle(
            pthr,
            rghHandlesToReference[dw],
            &dwRightsGranted,
            &pobj
            );

        if (NO_ERROR == palError)
        {
            palError = CheckObjectTypeAndRights(
                pobj,
                paot,
                dwRightsGranted,
                dwRightsRequired
                );

            if (NO_ERROR == palError)
            {
                //
                // Transfer reference to out array
                //

                rgpobjs[dw] = pobj;
                pobj = NULL;
            }
        }

        if (NO_ERROR != palError)
        {
            break;
        }
    }

    //
    // The handle manager lock must be released before releasing
    // any object references, as ReleaseReference will acquire
    // the object manager list lock (which needs to be acquired before
    // the handle manager lock)
    //

    m_HandleManager.Unlock(pthr);

    if (NO_ERROR != palError)
    {
        //
        // dw's current value is the failing index, so we want
        // to free from dw - 1.
        //
        
        while (dw > 0)
        {
            rgpobjs[--dw]->ReleaseReference(pthr);
        }

        if (NULL != pobj)
        {
            pobj->ReleaseReference(pthr);
        }
    }

    LOGEXIT("CSharedMemoryObjectManager::ReferenceMultipleObjectsByHandleArray"
        " returns %d\n",
        palError
        );

    return palError;
}